

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ImfChromaticities.cpp
# Opt level: O2

M44f * Imf_2_5::RGBtoXYZ(M44f *__return_storage_ptr__,Chromaticities *chroma,float Y)

{
  M44f *M;
  float fVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  float fVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float fVar9;
  float fVar10;
  float fVar11;
  float fVar12;
  float fVar13;
  float local_18;
  
  fVar1 = (chroma->white).x;
  fVar10 = (chroma->white).y;
  *(undefined8 *)(__return_storage_ptr__->x[2] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 3) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[1] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 2) + 8) = 0.0;
  *(undefined8 *)(__return_storage_ptr__->x[0] + 3) = 0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 4) = 0.0;
  *(float *)((long)(__return_storage_ptr__->x + 1) + 8) = 0.0;
  __return_storage_ptr__->x[3][3] = 1.0;
  fVar4 = (chroma->green).x;
  fVar5 = (chroma->green).y;
  fVar8 = (chroma->blue).y;
  fVar6 = (chroma->red).x;
  fVar7 = (chroma->red).y;
  auVar2._0_4_ = Y * fVar1;
  auVar2._4_4_ = Y * ((1.0 - fVar1) - fVar10);
  auVar2._8_4_ = Y * 0.0;
  auVar2._12_4_ = Y * 0.0;
  auVar3._4_4_ = fVar10;
  auVar3._0_4_ = fVar10;
  auVar3._8_4_ = fVar10;
  auVar3._12_4_ = fVar10;
  auVar3 = divps(auVar2,auVar3);
  fVar1 = auVar3._0_4_;
  fVar10 = auVar3._4_4_ + fVar1;
  fVar11 = (fVar7 + -1.0) * Y + fVar10 * fVar7;
  fVar12 = (fVar5 + -1.0) * Y + fVar5 * fVar10;
  fVar9 = (fVar8 + -1.0) * Y + fVar10 * fVar8;
  local_18 = (chroma->blue).x;
  fVar10 = (fVar7 - fVar8) * fVar4 + (fVar8 - fVar5) * fVar6 + (fVar5 - fVar7) * local_18;
  fVar13 = (fVar12 * local_18 + (fVar1 * (fVar8 - fVar5) - fVar9 * fVar4)) / fVar10;
  fVar9 = ((fVar1 * (fVar7 - fVar8) + fVar6 * fVar9) - fVar11 * local_18) / fVar10;
  fVar10 = (fVar4 * fVar11 + (fVar1 * (fVar5 - fVar7) - fVar12 * fVar6)) / fVar10;
  *(ulong *)__return_storage_ptr__->x[0] = CONCAT44(fVar13 * fVar7,fVar13 * fVar6);
  __return_storage_ptr__->x[0][2] = ((1.0 - fVar6) - fVar7) * fVar13;
  *(ulong *)__return_storage_ptr__->x[1] = CONCAT44(fVar9 * fVar5,fVar9 * fVar4);
  __return_storage_ptr__->x[1][2] = ((1.0 - fVar4) - fVar5) * fVar9;
  *(ulong *)__return_storage_ptr__->x[2] = CONCAT44(fVar10 * fVar8,fVar10 * local_18);
  __return_storage_ptr__->x[2][2] = ((1.0 - local_18) - fVar8) * fVar10;
  return __return_storage_ptr__;
}

Assistant:

IMATH_NAMESPACE::M44f
RGBtoXYZ (const Chromaticities &chroma, float Y)
{
    //
    // For an explanation of how the color conversion matrix is derived,
    // see Roy Hall, "Illumination and Color in Computer Generated Imagery",
    // Springer-Verlag, 1989, chapter 3, "Perceptual Response"; and 
    // Charles A. Poynton, "A Technical Introduction to Digital Video",
    // John Wiley & Sons, 1996, chapter 7, "Color science for video".
    //

    //
    // X and Z values of RGB value (1, 1, 1), or "white"
    //

    float X = chroma.white.x * Y / chroma.white.y;
    float Z = (1 - chroma.white.x - chroma.white.y) * Y / chroma.white.y;

    //
    // Scale factors for matrix rows
    //

    float d = chroma.red.x   * (chroma.blue.y  - chroma.green.y) +
	      chroma.blue.x  * (chroma.green.y - chroma.red.y) +
	      chroma.green.x * (chroma.red.y   - chroma.blue.y);

    float Sr = (X * (chroma.blue.y - chroma.green.y) -
	        chroma.green.x * (Y * (chroma.blue.y - 1) +
		chroma.blue.y  * (X + Z)) +
		chroma.blue.x  * (Y * (chroma.green.y - 1) +
		chroma.green.y * (X + Z))) / d;

    float Sg = (X * (chroma.red.y - chroma.blue.y) +
		chroma.red.x   * (Y * (chroma.blue.y - 1) +
		chroma.blue.y  * (X + Z)) -
		chroma.blue.x  * (Y * (chroma.red.y - 1) +
		chroma.red.y   * (X + Z))) / d;

    float Sb = (X * (chroma.green.y - chroma.red.y) -
		chroma.red.x   * (Y * (chroma.green.y - 1) +
		chroma.green.y * (X + Z)) +
		chroma.green.x * (Y * (chroma.red.y - 1) +
		chroma.red.y   * (X + Z))) / d;

    //
    // Assemble the matrix
    //

    IMATH_NAMESPACE::M44f M;

    M[0][0] = Sr * chroma.red.x;
    M[0][1] = Sr * chroma.red.y;
    M[0][2] = Sr * (1 - chroma.red.x - chroma.red.y);

    M[1][0] = Sg * chroma.green.x;
    M[1][1] = Sg * chroma.green.y;
    M[1][2] = Sg * (1 - chroma.green.x - chroma.green.y);

    M[2][0] = Sb * chroma.blue.x;
    M[2][1] = Sb * chroma.blue.y;
    M[2][2] = Sb * (1 - chroma.blue.x - chroma.blue.y);

    return M;
}